

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O1

void __thiscall
SMBusPacket::CreateFramesForGroupCommand
          (SMBusPacket *this,SMBusAnalyzerResults *pResults,bool has_pec)

{
  pointer pSVar1;
  pointer pvVar2;
  ulong uVar3;
  long lVar4;
  byte bVar5;
  Frame f;
  SMBusByte local_70;
  undefined1 local_50;
  undefined1 local_4f;
  long local_48;
  SMBusPacket *local_40;
  SMBusAnalyzerResults *local_38;
  
  pvVar2 = (this->chunks).
           super__Vector_base<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar2 != (this->chunks).
                super__Vector_base<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_48 = -(ulong)has_pec;
    local_40 = this;
    local_38 = pResults;
    do {
      SMBusByte::ToAddrFrame
                (&local_70,
                 (SMBusProtocol *)
                 (pvVar2->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
                 super__Vector_impl_data._M_start);
      AnalyzerResults::AddFrame((Frame *)pResults);
      Frame::~Frame((Frame *)&local_70);
      bVar5 = ""[((pvVar2->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
                  super__Vector_impl_data._M_start)->value];
      pSVar1 = (pvVar2->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Frame::Frame((Frame *)&local_70);
      local_50 = 0xb;
      local_70._0_8_ =
           **(U64 **)&pSVar1[1].signals.
                      super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
                      _M_impl.super__Vector_impl_data;
      local_70.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)(*(pointer *)
                      ((long)&pSVar1[1].signals.
                              super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>
                              ._M_impl + 8))[-1].sample_end;
      local_70.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)(ulong)pSVar1[1].value;
      local_70.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_4f = pSVar1[1].is_acked;
      AnalyzerResults::AddFrame((Frame *)pResults);
      Frame::~Frame((Frame *)&local_70);
      pSVar1 = (pvVar2->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar5 = ""[bVar5 ^ pSVar1[1].value];
      if (2 < (ulong)(((long)(pvVar2->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 5) +
                     local_48)) {
        uVar3 = 2;
        lVar4 = 0x40;
        do {
          pSVar1 = (pvVar2->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          Frame::Frame((Frame *)&local_70);
          pResults = local_38;
          local_50 = 6;
          local_70._0_8_ =
               **(U64 **)((long)&(pSVar1->signals).
                                 super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>
                                 ._M_impl + lVar4);
          local_70.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
          _M_impl.super__Vector_impl_data._M_start =
               *(pointer *)
                (*(long *)((long)&(pSVar1->signals).
                                  super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>
                                  ._M_impl + lVar4 + 8) + -0x20);
          local_70.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)(ulong)(&pSVar1->value)[lVar4];
          local_70.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_4f = (&pSVar1->is_acked)[lVar4];
          AnalyzerResults::AddFrame((Frame *)local_38);
          Frame::~Frame((Frame *)&local_70);
          pSVar1 = (pvVar2->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar3 = uVar3 + 1;
          bVar5 = ""[bVar5 ^ (&pSVar1->value)[lVar4]];
          lVar4 = lVar4 + 0x20;
        } while (uVar3 < (ulong)(((long)(pvVar2->
                                        super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >>
                                 5) + local_48));
      }
      if (has_pec) {
        pSVar1 = (pvVar2->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        Frame::Frame((Frame *)&local_70);
        local_50 = 9;
        local_70._0_8_ =
             (pSVar1[-1].signals.
              super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
              super__Vector_impl_data._M_start)->sample_begin;
        local_70.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)pSVar1[-1].signals.
                      super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].sample_end;
        local_70.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)(ulong)pSVar1[-1].value;
        local_70.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)bVar5;
        local_4f = pSVar1[-1].is_acked;
        AnalyzerResults::AddFrame((Frame *)pResults);
        Frame::~Frame((Frame *)&local_70);
      }
      pvVar2 = pvVar2 + 1;
    } while (pvVar2 != (local_40->chunks).
                       super__Vector_base<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void SMBusPacket::CreateFramesForGroupCommand( SMBusAnalyzerResults* pResults, bool has_pec ) const
{
    for( std::vector<std::vector<SMBusByte>>::const_iterator ci( chunks.begin() ); ci != chunks.end(); ++ci )
    {
        const std::vector<SMBusByte>& chunk( *ci );

        U8 pec = 0;

        pResults->AddFrame( chunk.front().ToAddrFrame( NULL ) ); // addr
        pec = SMBusCRCLookup[ pec ^ chunk.front().value ];
        pResults->AddFrame( chunk[ 1 ].ToPMBusCommandFrame() ); // command
        pec = SMBusCRCLookup[ pec ^ chunk[ 1 ].value ];

        for( size_t bcnt = 2; bcnt < chunk.size() - ( has_pec ? 1 : 0 ); ++bcnt )
        {
            pResults->AddFrame( chunk[ bcnt ].ToDataByte() );
            pec = SMBusCRCLookup[ pec ^ chunk[ bcnt ].value ];
        }

        if( has_pec )
            pResults->AddFrame( chunk.back().ToPECFrame( pec ) );
    }
}